

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXConverter::InterpolateKeys
          (FBXConverter *this,aiVectorKey *valOut,KeyTimeList *keys,KeyFrameListList *inputs,
          aiVector3D *def_value,double *max_time,double *min_time)

{
  float fVar1;
  uint uVar2;
  long lVar3;
  pointer ptVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long *plVar9;
  long lVar10;
  ulong uVar11;
  size_type __new_size;
  ulong uVar12;
  long lVar13;
  long lVar14;
  float fVar15;
  double dVar16;
  vector<unsigned_int,_std::allocator<unsigned_int>_> next_pos;
  float local_84 [3];
  long *local_78;
  FBXConverter *local_70;
  double *local_68;
  pointer local_60;
  pointer local_58;
  aiVector3D *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_70 = this;
  local_68 = max_time;
  local_50 = def_value;
  if ((keys->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (keys->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
LAB_00181737:
    __assert_fail("!keys.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0xcf4,
                  "void Assimp::FBX::FBXConverter::InterpolateKeys(aiVectorKey *, const KeyTimeList &, const KeyFrameListList &, const aiVector3D &, double &, double &)"
                 );
  }
  if (valOut == (aiVectorKey *)0x0) {
    __assert_fail("nullptr != valOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0xcf5,
                  "void Assimp::FBX::FBXConverter::InterpolateKeys(aiVectorKey *, const KeyTimeList &, const KeyFrameListList &, const aiVector3D &, double &, double &)"
                 );
  }
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = (inputs->
             super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (inputs->
             super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  __new_size = ((long)local_60 - (long)local_58 >> 3) * -0x3333333333333333;
  local_84[0] = 0.0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_48,__new_size,(value_type_conflict1 *)local_84);
  plVar9 = (keys->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_78 = (keys->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
  if (plVar9 != local_78) {
    do {
      lVar3 = *plVar9;
      local_84[0] = local_50->x;
      local_84[1] = local_50->y;
      local_84[2] = local_50->z;
      if (local_60 != local_58) {
        lVar13 = 6;
        lVar14 = 0;
        do {
          ptVar4 = (inputs->
                   super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          plVar5 = *(long **)((long)&(ptVar4->
                                     super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                     ).
                                     super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                     .super__Tuple_impl<2UL,_unsigned_int> + lVar13 * 4);
          lVar6 = *plVar5;
          lVar10 = plVar5[1] - lVar6;
          if (lVar10 != 0) {
            uVar11 = lVar10 >> 3;
            uVar2 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start[lVar14];
            if ((uVar2 < uVar11) && (*(long *)(lVar6 + (ulong)uVar2 * 8) == lVar3)) {
              local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14] = uVar2 + 1;
            }
            uVar2 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start[lVar14];
            uVar12 = (ulong)(uVar2 - 1);
            if (uVar2 == 0) {
              uVar12 = 0;
            }
            uVar8 = uVar11 - 1;
            if (uVar11 != uVar2) {
              uVar8 = (ulong)uVar2;
            }
            plVar5 = *(long **)((long)ptVar4 + lVar13 * 4 + -0x10);
            lVar6 = *plVar5;
            uVar11 = plVar5[1] - lVar6 >> 2;
            if (uVar12 < uVar11) {
              if (uVar11 <= uVar8) {
LAB_00181707:
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar8);
                goto LAB_00181718;
              }
              plVar5 = *(long **)((long)&(ptVar4->
                                         super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                         ).
                                         super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                         .super__Tuple_impl<2UL,_unsigned_int> + lVar13 * 4);
              lVar10 = *plVar5;
              uVar11 = plVar5[1] - lVar10 >> 3;
              if (uVar11 <= uVar12) {
                uVar8 = std::__throw_out_of_range_fmt
                                  (
                                  "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                  );
                goto LAB_00181707;
              }
              if (uVar8 < uVar11) {
                lVar7 = *(long *)(lVar10 + uVar12 * 8);
                fVar15 = 0.0;
                lVar10 = *(long *)(lVar10 + uVar8 * 8) - lVar7;
                if (lVar10 != 0) {
                  fVar15 = (float)(lVar3 - lVar7) / (float)lVar10;
                }
                fVar1 = *(float *)(lVar6 + uVar12 * 4);
                local_84[*(uint *)((long)ptVar4 + lVar13 * 4 + -0x18)] =
                     (*(float *)(lVar6 + uVar8 * 4) - fVar1) * fVar15 + fVar1;
                goto LAB_0018164f;
              }
            }
            else {
LAB_00181718:
              uVar8 = std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
            }
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar8);
            goto LAB_00181737;
          }
LAB_0018164f:
          lVar14 = lVar14 + 1;
          lVar13 = lVar13 + 10;
        } while (__new_size + (__new_size == 0) != lVar14);
      }
      dVar16 = ((double)lVar3 / 46186158000.0) * local_70->anim_fps;
      valOut->mTime = dVar16;
      if (*min_time <= dVar16) {
        dVar16 = *min_time;
      }
      *min_time = dVar16;
      dVar16 = valOut->mTime;
      if (valOut->mTime <= *local_68) {
        dVar16 = *local_68;
      }
      *local_68 = dVar16;
      (valOut->mValue).x = local_84[0];
      (valOut->mValue).y = local_84[1];
      (valOut->mValue).z = local_84[2];
      valOut = valOut + 1;
      plVar9 = plVar9 + 1;
    } while (plVar9 != local_78);
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FBXConverter::InterpolateKeys(aiVectorKey* valOut, const KeyTimeList& keys, const KeyFrameListList& inputs,
            const aiVector3D& def_value,
            double& max_time,
            double& min_time) {
            ai_assert(!keys.empty());
            ai_assert(nullptr != valOut);

            std::vector<unsigned int> next_pos;
            const size_t count(inputs.size());

            next_pos.resize(inputs.size(), 0);

            for (KeyTimeList::value_type time : keys) {
                ai_real result[3] = { def_value.x, def_value.y, def_value.z };

                for (size_t i = 0; i < count; ++i) {
                    const KeyFrameList& kfl = inputs[i];

                    const size_t ksize = std::get<0>(kfl)->size();
                    if (ksize == 0) {
                        continue;
                    }
                    if (ksize > next_pos[i] && std::get<0>(kfl)->at(next_pos[i]) == time) {
                        ++next_pos[i];
                    }

                    const size_t id0 = next_pos[i] > 0 ? next_pos[i] - 1 : 0;
                    const size_t id1 = next_pos[i] == ksize ? ksize - 1 : next_pos[i];

                    // use lerp for interpolation
                    const KeyValueList::value_type valueA = std::get<1>(kfl)->at(id0);
                    const KeyValueList::value_type valueB = std::get<1>(kfl)->at(id1);

                    const KeyTimeList::value_type timeA = std::get<0>(kfl)->at(id0);
                    const KeyTimeList::value_type timeB = std::get<0>(kfl)->at(id1);

                    const ai_real factor = timeB == timeA ? ai_real(0.) : static_cast<ai_real>((time - timeA)) / (timeB - timeA);
                    const ai_real interpValue = static_cast<ai_real>(valueA + (valueB - valueA) * factor);

                    result[std::get<2>(kfl)] = interpValue;
                }

                // magic value to convert fbx times to seconds
                valOut->mTime = CONVERT_FBX_TIME(time) * anim_fps;

                min_time = std::min(min_time, valOut->mTime);
                max_time = std::max(max_time, valOut->mTime);

                valOut->mValue.x = result[0];
                valOut->mValue.y = result[1];
                valOut->mValue.z = result[2];

                ++valOut;
            }
        }